

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeArrayLen(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this)

{
  ArrayLen *pAVar1;
  bool bVar2;
  Ok local_95;
  uint local_94;
  Err local_90;
  Err *local_60;
  Err *err;
  Result<wasm::Ok> _val;
  ArrayLen curr;
  IRBuilder *this_local;
  
  pAVar1 = (ArrayLen *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  ArrayLen::ArrayLen(pAVar1);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitArrayLen
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pAVar1);
  local_60 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar2 = local_60 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_90,local_60);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_90);
    wasm::Err::~Err(&local_90);
  }
  local_94 = (uint)bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_94 == 0) {
    pAVar1 = Builder::makeArrayLen
                       (&this->builder,
                        (Expression *)
                        curr.super_SpecificExpression<(wasm::Expression::Id)76>.super_Expression.
                        type.id);
    push(this,(Expression *)pAVar1);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_95);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeArrayLen() {
  ArrayLen curr;
  CHECK_ERR(visitArrayLen(&curr));
  push(builder.makeArrayLen(curr.ref));
  return Ok{};
}